

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  long lVar2;
  char local_29 [8];
  char byte;
  
  this->fixed_buffer_used_size_ = 0;
  (this->glowable_buffer_)._M_string_length = 0;
  *(this->glowable_buffer_)._M_dataplus._M_p = '\0';
  lVar2 = 0;
  while( true ) {
    iVar1 = (*this->strm_->_vptr_Stream[2])(this->strm_,local_29,1);
    if (iVar1 < 0) {
      return 0;
    }
    if (iVar1 == 0) break;
    append(this,local_29[0]);
    if (local_29[0] == '\n') {
      return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    lVar2 = lVar2 + -1;
  }
  return CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),lVar2 != 0);
}

Assistant:

bool getline() {
        fixed_buffer_used_size_ = 0;
        glowable_buffer_.clear();

        for (size_t i = 0; ; i++) {
            char byte;
            auto n = strm_.read(&byte, 1);

            if (n < 0) {
                return false;
            } else if (n == 0) {
                if (i == 0) {
                    return false;
                } else {
                    break;
                }
            }

            append(byte);

            if (byte == '\n') {
                break;
            }
        }

        return true;
    }